

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O2

void print_timer(int n,TMCNT_H_t *tmcnth,int timer_reload,TMINT_t *tmint)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = *(int *)(&DAT_0012563c + (ulong)(*(uint *)&tmcnth->raw & 3) * 4);
  pcVar2 = "ENABLED";
  if (-1 < (char)*(uint *)&tmcnth->raw) {
    pcVar2 = "disabled";
  }
  DUI_Print("\nTimer %d: %s",n,pcVar2);
  _duiCursor.y = _duiCursor.y + _duiStyle.LineHeight;
  pcVar2 = "";
  if (n == 0) {
    pcVar2 = " (unused in Timer 0)";
  }
  _duiCursor.x = _duiLineStart;
  DUI_Print(" Reload: 0x%04X\n Prescaler: %s\n Count-Up Timing:%s %d\n IRQ: %d\n Value: 0x%04X\n",
            (ulong)(uint)timer_reload,&DAT_0012563c + iVar1,pcVar2,(ulong)(tmcnth->raw >> 2 & 1),
            (ulong)(tmcnth->raw >> 6 & 1),(uint)tmint->value);
  _duiCursor.y = _duiCursor.y + _duiStyle.LineHeight;
  _duiCursor.x = _duiLineStart;
  return;
}

Assistant:

void print_timer(int n, TMCNT_H_t* tmcnth, int timer_reload, TMINT_t* tmint) {
    const char* prescaler_selection = "UNKNOWN";
    switch (tmcnth->frequency) {
        case 0:
            prescaler_selection = "F/1";
            break;
        case 1:
            prescaler_selection = "F/64";
            break;
        case 2:
            prescaler_selection = "F/256";
            break;
        case 3:
            prescaler_selection = "F/1024";
            break;
    }
    const char* enabled = tmcnth->start ? "ENABLED" : "disabled";
    DUI_Println("\nTimer %d: %s", n, enabled);
    const char* tm0msg = n == 0 ? " (unused in Timer 0)" : "";
    DUI_Println(" Reload: 0x%04X\n"
                " Prescaler: %s\n"
                " Count-Up Timing:%s %d\n"
                " IRQ: %d\n"
                " Value: 0x%04X\n",
                timer_reload,
                prescaler_selection,
                tm0msg,
                tmcnth->cascade,
                tmcnth->timer_irq_enable,
                tmint->value);
}